

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

Result __thiscall wabt::interp::Table::Fill(Table *this,Store *store,u32 offset,Ref ref,u32 size)

{
  pointer pRVar1;
  bool bVar2;
  Enum EVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  bVar2 = Store::HasValueType(store,ref,*(ValueType *)&(this->type_).super_ExternType.field_0xc);
  if (bVar2) {
    pRVar1 = (this->elements_).
             super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = (long)(this->elements_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pRVar1 >> 3;
    uVar4 = (ulong)size;
    if (uVar5 - uVar4 < (ulong)offset || uVar5 < uVar4) {
      EVar3 = Error;
    }
    else {
      EVar3 = Ok;
      for (lVar6 = 0; uVar4 << 3 != lVar6; lVar6 = lVar6 + 8) {
        *(size_t *)((long)&pRVar1[offset].index + lVar6) = ref.index;
      }
    }
    return (Result)EVar3;
  }
  __assert_fail("store.HasValueType(ref, type_.element)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/interp.cc"
                ,0x216,"Result wabt::interp::Table::Fill(Store &, u32, Ref, u32)");
}

Assistant:

Result Table::Fill(Store& store, u32 offset, Ref ref, u32 size) {
  assert(store.HasValueType(ref, type_.element));
  if (IsValidRange(offset, size)) {
    std::fill(elements_.begin() + offset, elements_.begin() + offset + size,
              ref);
    return Result::Ok;
  }
  return Result::Error;
}